

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.c
# Opt level: O2

int fwd_data_pipeline(uint8_t *data,size_t length,uint8_t *name,size_t name_len,
                     ndn_table_id_t face_id)

{
  ndn_pit_entry_t *entry;
  ndn_pit_entry_t *pnVar1;
  int iVar2;
  
  entry = ndn_pit_prefix_match(forwarder.pit,name,name_len);
  iVar2 = -0x38;
  if (entry != (ndn_pit_entry_t *)0x0) {
    if (((entry->options).can_be_prefix == false) &&
       (pnVar1 = ndn_pit_find(forwarder.pit,name,name_len), pnVar1 != entry)) {
      return -0x38;
    }
    if (entry->on_data != (ndn_on_data_func)0x0) {
      (*entry->on_data)(data,(uint32_t)length,entry->userdata);
    }
    fwd_multicast(data,length,entry->incoming_faces,face_id);
    ndn_pit_remove_entry(forwarder.pit,entry);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
fwd_data_pipeline(uint8_t* data,
                  size_t length,
                  uint8_t* name,
                  size_t name_len,
                  ndn_table_id_t face_id)
{
  ndn_pit_entry_t* pit_entry;

  pit_entry = ndn_pit_prefix_match(forwarder.pit, name, name_len);
  if (pit_entry == NULL) {
    return NDN_FWD_NO_ROUTE;
  }
  if (!pit_entry->options.can_be_prefix) {
    // Quick and dirty solution
    if (ndn_pit_find(forwarder.pit, name, name_len) != pit_entry)
      return NDN_FWD_NO_ROUTE;
  }

  if (pit_entry->on_data != NULL) {
    pit_entry->on_data(data, length, pit_entry->userdata);
  }

  fwd_multicast(data, length, pit_entry->incoming_faces, face_id);

  ndn_pit_remove_entry(forwarder.pit, pit_entry);

  return NDN_SUCCESS;
}